

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsScissorMultiViewportTests.cpp
# Opt level: O0

void vkt::FragmentOperations::anon_unknown_0::initPrograms
               (SourceCollections *programCollection,int numViewports)

{
  char *pcVar1;
  ostream *poVar2;
  ProgramSources *pPVar3;
  string local_5e0;
  ShaderSource local_5c0;
  allocator<char> local_591;
  string local_590;
  ostringstream local_570 [8];
  ostringstream src_2;
  string local_3f8;
  ShaderSource local_3d8;
  allocator<char> local_3a9;
  string local_3a8;
  ostringstream local_388 [8];
  ostringstream src_1;
  string local_210;
  ShaderSource local_1f0;
  allocator<char> local_1c1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream src;
  int numViewports_local;
  SourceCollections *programCollection_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar2 = std::operator<<((ostream *)local_190,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in  vec4 in_color;\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out vec4 out_color;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"void main(void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"    out_color = in_color;\n");
  std::operator<<(poVar2,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"vert",&local_1c1);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1c0);
  std::__cxx11::ostringstream::str();
  glu::VertexSource::VertexSource((VertexSource *)&local_1f0,&local_210);
  glu::ProgramSources::operator<<(pPVar3,&local_1f0);
  glu::VertexSource::~VertexSource((VertexSource *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::__cxx11::ostringstream::ostringstream(local_388);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar2 = std::operator<<((ostream *)local_388,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(points) in;\n");
  poVar2 = std::operator<<(poVar2,"layout(triangle_strip, max_vertices=4) out;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"out gl_PerVertex {\n");
  poVar2 = std::operator<<(poVar2,"    vec4 gl_Position;\n");
  poVar2 = std::operator<<(poVar2,"};\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in  vec4 in_color[];\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out vec4 out_color;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"void main(void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"    gl_ViewportIndex = gl_PrimitiveIDIn;\n");
  poVar2 = std::operator<<(poVar2,"    gl_Position      = vec4(-1.0, -1.0, 0.0, 1.0);\n");
  poVar2 = std::operator<<(poVar2,"    out_color        = in_color[0];\n");
  poVar2 = std::operator<<(poVar2,"    EmitVertex();");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"    gl_ViewportIndex = gl_PrimitiveIDIn;\n");
  poVar2 = std::operator<<(poVar2,"    gl_Position      = vec4(-1.0, 1.0, 0.0, 1.0);\n");
  poVar2 = std::operator<<(poVar2,"    out_color        = in_color[0];\n");
  poVar2 = std::operator<<(poVar2,"    EmitVertex();");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"    gl_ViewportIndex = gl_PrimitiveIDIn;\n");
  poVar2 = std::operator<<(poVar2,"    gl_Position      = vec4(1.0, -1.0, 0.0, 1.0);\n");
  poVar2 = std::operator<<(poVar2,"    out_color        = in_color[0];\n");
  poVar2 = std::operator<<(poVar2,"    EmitVertex();");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"    gl_ViewportIndex = gl_PrimitiveIDIn;\n");
  poVar2 = std::operator<<(poVar2,"    gl_Position      = vec4(1.0, 1.0, 0.0, 1.0);\n");
  poVar2 = std::operator<<(poVar2,"    out_color        = in_color[0];\n");
  poVar2 = std::operator<<(poVar2,"    EmitVertex();");
  std::operator<<(poVar2,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"geom",&local_3a9);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_3a8);
  std::__cxx11::ostringstream::str();
  glu::GeometrySource::GeometrySource((GeometrySource *)&local_3d8,&local_3f8);
  glu::ProgramSources::operator<<(pPVar3,&local_3d8);
  glu::GeometrySource::~GeometrySource((GeometrySource *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  std::__cxx11::ostringstream::~ostringstream(local_388);
  std::__cxx11::ostringstream::ostringstream(local_570);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar2 = std::operator<<((ostream *)local_570,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in  vec4 in_color;\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out vec4 out_color;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"void main(void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"    out_color = in_color;\n");
  std::operator<<(poVar2,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_590,"frag",&local_591);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_590);
  std::__cxx11::ostringstream::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_5c0,&local_5e0);
  glu::ProgramSources::operator<<(pPVar3,&local_5c0);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_5c0);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator(&local_591);
  std::__cxx11::ostringstream::~ostringstream(local_570);
  return;
}

Assistant:

void initPrograms (SourceCollections& programCollection, const int numViewports)
{
	DE_UNREF(numViewports);

	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_color;\n"
			<< "layout(location = 0) out vec4 out_color;\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    out_color = in_color;\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Geometry shader
	{
		// Each input point generates a fullscreen quad.

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(points) in;\n"
			<< "layout(triangle_strip, max_vertices=4) out;\n"
			<< "\n"
			<< "out gl_PerVertex {\n"
			<< "    vec4 gl_Position;\n"
			<< "};\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_color[];\n"
			<< "layout(location = 0) out vec4 out_color;\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    gl_ViewportIndex = gl_PrimitiveIDIn;\n"
			<< "    gl_Position      = vec4(-1.0, -1.0, 0.0, 1.0);\n"
			<< "    out_color        = in_color[0];\n"
			<< "    EmitVertex();"
			<< "\n"
			<< "    gl_ViewportIndex = gl_PrimitiveIDIn;\n"
			<< "    gl_Position      = vec4(-1.0, 1.0, 0.0, 1.0);\n"
			<< "    out_color        = in_color[0];\n"
			<< "    EmitVertex();"
			<< "\n"
			<< "    gl_ViewportIndex = gl_PrimitiveIDIn;\n"
			<< "    gl_Position      = vec4(1.0, -1.0, 0.0, 1.0);\n"
			<< "    out_color        = in_color[0];\n"
			<< "    EmitVertex();"
			<< "\n"
			<< "    gl_ViewportIndex = gl_PrimitiveIDIn;\n"
			<< "    gl_Position      = vec4(1.0, 1.0, 0.0, 1.0);\n"
			<< "    out_color        = in_color[0];\n"
			<< "    EmitVertex();"
			<< "}\n";

		programCollection.glslSources.add("geom") << glu::GeometrySource(src.str());
	}

	// Fragment shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_color;\n"
			<< "layout(location = 0) out vec4 out_color;\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    out_color = in_color;\n"
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}
}